

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O3

tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> * __thiscall
polyscope::TransformationGizmo::lineTest
          (tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *__return_storage_ptr__,
          TransformationGizmo *this,vec3 raySource,vec3 rayDir,vec3 center,vec3 tangent,float length
          )

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  _Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined8 in_XMM6_Qb;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar23;
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  auVar20._4_60_ = rayDir._12_60_;
  auVar20._0_4_ = rayDir.field_2;
  auVar18._8_56_ = rayDir._8_56_;
  auVar18._0_8_ = rayDir._0_8_;
  auVar14._4_60_ = raySource._12_60_;
  auVar14._0_4_ = raySource.field_2;
  auVar12._8_56_ = raySource._8_56_;
  auVar12._0_8_ = raySource._0_8_;
  auVar26._4_60_ = tangent._12_60_;
  auVar26._0_4_ = tangent.field_2;
  uVar1 = tangent._0_8_;
  auVar22._4_60_ = center._12_60_;
  auVar22._0_4_ = center.field_2;
  auVar21._8_56_ = center._8_56_;
  auVar21._0_8_ = center._0_8_;
  auVar11._8_8_ = in_XMM6_Qb;
  auVar11._0_8_ = uVar1;
  auVar11 = vmovshdup_avx(auVar11);
  auVar16 = auVar18._0_16_;
  auVar27 = vmovshdup_avx(auVar16);
  auVar5._8_8_ = in_XMM6_Qb;
  auVar5._0_8_ = uVar1;
  auVar5 = vfmsub231ss_fma(ZEXT416((uint)(rayDir.field_0.x * auVar26._0_4_)),auVar20._0_16_,auVar5);
  auVar7 = vfmsub231ss_fma(ZEXT416((uint)(auVar11._0_4_ * auVar20._0_4_)),auVar27,auVar26._0_16_);
  auVar11 = vfmsub231ss_fma(ZEXT416((uint)(auVar27._0_4_ * tangent.field_0.x)),auVar16,auVar11);
  fVar29 = auVar5._0_4_;
  auVar27._0_4_ = auVar7._0_4_;
  auVar7._0_4_ = auVar11._0_4_;
  auVar11 = ZEXT416((uint)(auVar7._0_4_ * auVar7._0_4_ +
                          auVar27._0_4_ * auVar27._0_4_ + fVar29 * fVar29));
  auVar11 = vsqrtss_avx(auVar11,auVar11);
  if (1e-06 <= auVar11._0_4_) {
    auVar11 = vinsertps_avx(auVar26._0_16_,auVar20._0_16_,0x10);
    auVar24._4_4_ = fVar29;
    auVar24._0_4_ = fVar29;
    auVar24._8_4_ = fVar29;
    auVar24._12_4_ = fVar29;
    auVar8 = auVar12._0_16_;
    auVar13 = auVar21._0_16_;
    auVar5 = vinsertps_avx(auVar13,auVar8,0x1c);
    auVar2 = vinsertps_avx(auVar8,auVar13,0x1c);
    auVar3 = vinsertps_avx(auVar13,auVar8,0x4c);
    auVar7._4_4_ = auVar7._0_4_;
    auVar7._8_4_ = auVar7._0_4_;
    auVar7._12_4_ = auVar7._0_4_;
    auVar4._8_8_ = in_XMM6_Qb;
    auVar4._0_8_ = uVar1;
    auVar4 = vinsertps_avx(auVar4,auVar16,0x1c);
    auVar27._4_4_ = auVar27._0_4_;
    auVar27._8_4_ = auVar27._0_4_;
    auVar27._12_4_ = auVar27._0_4_;
    auVar10 = vinsertps_avx(auVar14._0_16_,auVar22._0_16_,0x10);
    auVar25 = vsubps_avx(auVar5,auVar2);
    auVar5 = vinsertps_avx(auVar8,auVar13,0x4c);
    auVar2 = vshufps_avx(auVar10,auVar10,0xe1);
    auVar30._0_4_ = fVar29 * auVar11._0_4_;
    auVar30._4_4_ = fVar29 * auVar11._4_4_;
    auVar30._8_4_ = fVar29 * auVar11._8_4_;
    auVar30._12_4_ = fVar29 * auVar11._12_4_;
    auVar3 = vsubps_avx(auVar5,auVar3);
    auVar8._8_8_ = in_XMM6_Qb;
    auVar8._0_8_ = uVar1;
    auVar5 = vinsertps_avx(auVar16,auVar8,0x4c);
    auVar2 = vsubps_avx(auVar2,auVar10);
    auVar8 = vfmsub231ps_fma(auVar30,auVar5,auVar7);
    auVar31._0_4_ = auVar4._0_4_ * auVar7._0_4_;
    auVar31._4_4_ = auVar4._4_4_ * auVar7._0_4_;
    auVar31._8_4_ = auVar4._8_4_ * auVar7._0_4_;
    auVar31._12_4_ = auVar4._12_4_ * auVar7._0_4_;
    auVar7 = vfmsub231ps_fma(auVar31,auVar11,auVar27);
    auVar28._0_4_ = auVar5._0_4_ * auVar27._0_4_;
    auVar28._4_4_ = auVar5._4_4_ * auVar27._0_4_;
    auVar28._8_4_ = auVar5._8_4_ * auVar27._0_4_;
    auVar28._12_4_ = auVar5._12_4_ * auVar27._0_4_;
    auVar5 = vshufps_avx(auVar11,auVar11,0xe1);
    auVar4 = vfmsub231ps_fma(auVar28,auVar4,auVar24);
    auVar13._0_4_ =
         auVar4._0_4_ * auVar2._0_4_ + auVar3._0_4_ * auVar7._0_4_ + auVar25._0_4_ * auVar8._0_4_;
    auVar13._4_4_ =
         auVar4._4_4_ * auVar2._4_4_ + auVar3._4_4_ * auVar7._4_4_ + auVar25._4_4_ * auVar8._4_4_;
    auVar13._8_4_ =
         auVar4._8_4_ * auVar2._8_4_ + auVar3._8_4_ * auVar7._8_4_ + auVar25._8_4_ * auVar8._8_4_;
    auVar13._12_4_ =
         auVar4._12_4_ * auVar2._12_4_ +
         auVar3._12_4_ * auVar7._12_4_ + auVar25._12_4_ * auVar8._12_4_;
    auVar2._8_8_ = in_XMM6_Qb;
    auVar2._0_8_ = uVar1;
    auVar11 = vinsertps_avx(auVar16,auVar2,0x1c);
    auVar3._8_8_ = in_XMM6_Qb;
    auVar3._0_8_ = uVar1;
    auVar27 = vinsertps_avx(auVar3,auVar16,0x4c);
    auVar25._0_4_ =
         auVar4._0_4_ * auVar5._0_4_ + auVar27._0_4_ * auVar7._0_4_ + auVar8._0_4_ * auVar11._0_4_;
    auVar25._4_4_ =
         auVar4._4_4_ * auVar5._4_4_ + auVar27._4_4_ * auVar7._4_4_ + auVar8._4_4_ * auVar11._4_4_;
    auVar25._8_4_ =
         auVar4._8_4_ * auVar5._8_4_ + auVar27._8_4_ * auVar7._8_4_ + auVar8._8_4_ * auVar11._8_4_;
    auVar25._12_4_ =
         auVar4._12_4_ * auVar5._12_4_ +
         auVar27._12_4_ * auVar7._12_4_ + auVar8._12_4_ * auVar11._12_4_;
    auVar16._8_4_ = 0x80000000;
    auVar16._0_8_ = 0x8000000080000000;
    auVar16._12_4_ = 0x80000000;
    auVar7 = vxorps_avx512vl(ZEXT416((uint)length),auVar16);
    auVar11 = vdivps_avx(auVar13,auVar25);
    fVar29 = auVar11._0_4_;
    auVar27 = vmovshdup_avx(auVar11);
    fVar23 = auVar27._0_4_;
    if (((auVar7._0_4_ <= fVar23) && (fVar23 <= length)) && (0.0 <= fVar29)) {
      auVar19._0_4_ = fVar23 * tangent.field_0.x + center.field_0.x;
      auVar19._4_4_ = auVar27._4_4_ * tangent.field_1.y + center.field_1.y;
      auVar19._8_4_ = auVar27._8_4_ * (float)in_XMM6_Qb + center.field_2;
      auVar19._12_4_ = auVar27._12_4_ * (float)((ulong)in_XMM6_Qb >> 0x20) + center._12_4_;
      auVar9._0_4_ = fVar29 * rayDir.field_0.x + raySource.field_0.x;
      auVar9._4_4_ = fVar29 * rayDir.field_1.y + raySource.field_1.y;
      auVar9._8_4_ = fVar29 * rayDir.field_2 + raySource.field_2;
      auVar9._12_4_ = fVar29 * rayDir._12_4_ + raySource._12_4_;
      auVar17._0_4_ = fVar29 * auVar5._0_4_ + auVar10._0_4_;
      auVar17._4_4_ = auVar11._4_4_ * auVar5._4_4_ + auVar10._4_4_;
      auVar17._8_4_ = auVar11._8_4_ * auVar5._8_4_ + auVar10._8_4_;
      auVar17._12_4_ = auVar11._12_4_ * auVar5._12_4_ + auVar10._12_4_;
      auVar5 = vsubps_avx(auVar9,auVar19);
      auVar27 = vhsubps_avx(auVar17,auVar17);
      auVar11 = vmovshdup_avx(auVar17);
      fVar15 = auVar11._0_4_;
      uVar1 = vmovlps_avx(auVar19);
      p_Var6 = &(__return_storage_ptr__->
                super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
                super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
      (p_Var6->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
      (p_Var6->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar1 >> 0x20);
      auVar10._0_4_ = auVar5._0_4_ * auVar5._0_4_;
      auVar10._4_4_ = auVar5._4_4_ * auVar5._4_4_;
      auVar10._8_4_ = auVar5._8_4_ * auVar5._8_4_;
      auVar10._12_4_ = auVar5._12_4_ * auVar5._12_4_;
      auVar11 = vhaddps_avx(auVar10,auVar10);
      auVar11 = ZEXT416((uint)(auVar27._0_4_ * auVar27._0_4_ + auVar11._0_4_));
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      fVar23 = auVar11._0_4_;
      goto LAB_0023620c;
    }
  }
  fVar29 = -1.0;
  fVar23 = INFINITY;
  p_Var6 = &(__return_storage_ptr__->
            super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
            super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
  (p_Var6->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  (p_Var6->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  fVar15 = 0.0;
LAB_0023620c:
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2.z =
       fVar15;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Head_base<1UL,_float,_false>._M_head_impl = fVar23;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<0UL,_float,_false>._M_head_impl = fVar29;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<float, float, glm::vec3> TransformationGizmo::lineTest(glm::vec3 raySource, glm::vec3 rayDir,
                                                                  glm::vec3 center, glm::vec3 tangent, float length) {

  // used for explicit constructors below to make old compilers (gcc-5) happy
  typedef std::tuple<float, float, glm::vec3> ret_t;

  glm::vec3 nBetween = glm::cross(rayDir, tangent);
  if (glm::length(nBetween) < 1e-6)
    return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}}; // parallel

  glm::vec3 nTan = glm::cross(tangent, nBetween);
  glm::vec3 nRay = glm::cross(rayDir, nBetween);

  float tRay = glm::dot(center - raySource, nTan) / glm::dot(rayDir, nTan);
  float tLine = glm::dot(raySource - center, nRay) / glm::dot(tangent, nRay);

  if (tLine < -length || tLine > length || tRay < 0)
    return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}}; // out of bounds or beind

  glm::vec3 pRay = raySource + tRay * rayDir;
  glm::vec3 pLine = center + tLine * tangent;

  return ret_t{tRay, glm::length(pRay - pLine), pLine};
}